

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_Texture::IsValid(ON_Texture *this,ON_TextLog *text_log)

{
  TYPE TVar1;
  
  TVar1 = this->m_type;
  if (text_log != (ON_TextLog *)0x0 && TVar1 == no_texture_type) {
    ON_TextLog::Print(text_log,"ON_Texture m_type has invalid value.\n");
  }
  return TVar1 != no_texture_type;
}

Assistant:

bool ON_Texture::IsValid( ON_TextLog* text_log ) const
{
  if ( ON_Texture::TYPE::no_texture_type == m_type )
  {
    if ( text_log )
    {
      text_log->Print("ON_Texture m_type has invalid value.\n");
    }
    return false;
  }

  // TODO ...

  return true;
}